

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O3

int main(void)

{
  int iVar1;
  FILE *pFVar2;
  
  remove("test_support/testfile");
  _PDCLIB_filemode((char *)0x0);
  _PDCLIB_filemode("w");
  pFVar2 = fopen("",(char *)0x0);
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fopen.c, line %d - %s\n"
           ,0x5c,"fopen( \"\", ((void *)0) ) == ((void *)0)");
  }
  pFVar2 = fopen("","w");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fopen.c, line %d - %s\n"
           ,0x5d,"fopen( \"\", \"w\" ) == NULL");
  }
  pFVar2 = fopen("test_support/testfile","");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fopen.c, line %d - %s\n"
           ,0x5e,"fopen( testfile, \"\" ) == NULL");
  }
  pFVar2 = fopen("test_support/testfile","wq");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fopen.c, line %d - %s\n"
           ,0x5f,"fopen( testfile, \"wq\" ) == ((void *)0)");
  }
  pFVar2 = fopen("test_support/testfile","wr");
  if (pFVar2 != (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fopen.c, line %d - %s\n"
           ,0x60,"fopen( testfile, \"wr\" ) == ((void *)0)");
  }
  pFVar2 = fopen("test_support/testfile","w");
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fopen.c, line %d - %s\n"
           ,0x61,"( fh = fopen( testfile, \"w\" ) ) != NULL");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fopen.c, line %d - %s\n"
           ,0x62,"fclose( fh ) == 0");
  }
  iVar1 = remove("test_support/testfile");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fopen.c, line %d - %s\n"
           ,99,"remove( testfile ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    /* Some of the tests are not executed for regression tests, as the libc on
       my system is at once less forgiving (segfaults on mode NULL) and more
       forgiving (accepts undefined modes).
    */
    FILE * fh;
    remove( testfile );
    TESTCASE_NOREG( fopen( NULL, NULL ) == NULL );
    TESTCASE_NOREG( fopen( NULL, "w" ) == NULL );
    TESTCASE_NOREG( fopen( "", NULL ) == NULL );
    TESTCASE( fopen( "", "w" ) == NULL );
    TESTCASE( fopen( testfile, "" ) == NULL );
    TESTCASE_NOREG( fopen( testfile, "wq" ) == NULL ); /* Undefined mode */
    TESTCASE_NOREG( fopen( testfile, "wr" ) == NULL ); /* Undefined mode */
    TESTCASE( ( fh = fopen( testfile, "w" ) ) != NULL );
    TESTCASE( fclose( fh ) == 0 );
    TESTCASE( remove( testfile ) == 0 );
    return TEST_RESULTS;
}